

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GetUnionElement_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumVal *ev,bool native_type,
          IDLOptions *opts)

{
  bool bVar1;
  char *__s;
  allocator<char> local_7d [13];
  string local_70;
  undefined1 local_50 [8];
  string name;
  IDLOptions *opts_local;
  bool native_type_local;
  EnumVal *ev_local;
  CppGenerator *this_local;
  
  name.field_2._8_8_ = opts;
  if ((ev->union_type).base_type == BASE_TYPE_STRUCT) {
    std::__cxx11::string::string((string *)local_50,(string *)(ev->union_type).struct_def);
    if (native_type) {
      NativeName(&local_70,(string *)local_50,(ev->union_type).struct_def,
                 (IDLOptions *)name.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    BaseGenerator::WrapInNameSpace
              (__return_storage_ptr__,&this->super_BaseGenerator,
               (((ev->union_type).struct_def)->super_Definition).defined_namespace,
               (string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    bVar1 = IsString(&ev->union_type);
    if (!bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x423,
                    "std::string flatbuffers::cpp::CppGenerator::GetUnionElement(const EnumVal &, bool, const IDLOptions &)"
                   );
    }
    __s = "::flatbuffers::String";
    if (native_type) {
      __s = "std::string";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_7d);
    std::allocator<char>::~allocator(local_7d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetUnionElement(const EnumVal &ev, bool native_type,
                              const IDLOptions &opts) {
    if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
      std::string name = ev.union_type.struct_def->name;
      if (native_type) {
        name = NativeName(std::move(name), ev.union_type.struct_def, opts);
      }
      return WrapInNameSpace(ev.union_type.struct_def->defined_namespace, name);
    } else if (IsString(ev.union_type)) {
      return native_type ? "std::string" : "::flatbuffers::String";
    } else {
      FLATBUFFERS_ASSERT(false);
      return Name(ev);
    }
  }